

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O0

ssize_t __thiscall VCProjectWriter::write(VCProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  XmlOutput *this_00;
  XmlOutput *this_01;
  XmlOutput *v;
  XmlOutput *toTag;
  XmlOutput *o;
  XmlOutput *this_02;
  long in_FS_OFFSET;
  QString *in_stack_fffffffffffffbd8;
  QStringList *in_stack_fffffffffffffbe0;
  QString *in_stack_fffffffffffffbe8;
  char *in_stack_fffffffffffffc08;
  char *ch;
  xml_output *in_stack_fffffffffffffc18;
  XmlOutput *in_stack_fffffffffffffc20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString(in_stack_fffffffffffffbd8,in_stack_fffffffffffffc08);
  tag(in_stack_fffffffffffffbe8);
  this_00 = XmlOutput::operator<<(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  QString::QString(in_stack_fffffffffffffbd8,in_stack_fffffffffffffc08);
  attrS((char *)in_stack_fffffffffffffbd8,(QString *)this_00);
  this_01 = XmlOutput::operator<<(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  ch = ",";
  attrX((char *)in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,(char *)this_01);
  v = XmlOutput::operator<<(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  attrX((char *)in_stack_fffffffffffffbe8,(QStringList *)v,(char *)this_01);
  toTag = XmlOutput::operator<<(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  attrX((char *)toTag,(QStringList *)v,(char *)this_01);
  XmlOutput::operator<<(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  attrX((char *)toTag,(QStringList *)v,(char *)this_01);
  XmlOutput::operator<<(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  attrX((char *)toTag,(QStringList *)v,(char *)this_01);
  XmlOutput::operator<<(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  attrT((char *)v,(triState)((ulong)this_01 >> 0x20));
  XmlOutput::operator<<(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  attrX((char *)toTag,(QStringList *)v,(char *)this_01);
  o = XmlOutput::operator<<(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  attrS((char *)this_01,(QString *)this_00);
  this_02 = XmlOutput::operator<<(in_stack_fffffffffffffc20,(xml_output *)o);
  attrS((char *)this_01,(QString *)this_00);
  XmlOutput::operator<<(this_02,(xml_output *)o);
  attrT((char *)v,(triState)((ulong)this_01 >> 0x20));
  XmlOutput::operator<<(this_02,(xml_output *)o);
  QString::QString((QString *)this_01,ch);
  closetag((QString *)toTag);
  XmlOutput::operator<<(this_02,(xml_output *)o);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  QString::~QString((QString *)0x27c17f);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  QString::~QString((QString *)0x27c21b);
  XmlOutput::xml_output::~xml_output((xml_output *)this_00);
  QString::~QString((QString *)0x27c235);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCProjectWriter::write(XmlOutput &xml, const VCLibrarianTool &tool)
{
    xml
        << tag(_Tool)
            << attrS(_Name, _VCLibrarianTool)
            << attrX(_AdditionalDependencies, tool.AdditionalDependencies)
            << attrX(_AdditionalLibraryDirectories, tool.AdditionalLibraryDirectories)
            << attrX(_AdditionalOptions, tool.AdditionalOptions, " ")
            << attrX(_ExportNamedFunctions, tool.ExportNamedFunctions)
            << attrX(_ForceSymbolReferences, tool.ForceSymbolReferences)
            << attrT(_IgnoreAllDefaultLibraries, tool.IgnoreAllDefaultLibraries)
            << attrX(_IgnoreDefaultLibraryNames, tool.IgnoreDefaultLibraryNames)
            << attrS(_ModuleDefinitionFile, tool.ModuleDefinitionFile)
            << attrS(_OutputFile, tool.OutputFile)
            << attrT(_SuppressStartupBanner, tool.SuppressStartupBanner)
        << closetag(_Tool);
}